

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

string * __thiscall setup::info::get_key(info *this,string *password)

{
  long lVar1;
  runtime_error *this_00;
  EVP_PKEY_CTX *ctx;
  uchar *key;
  size_t *keylen;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long in_RSI;
  string *in_RDI;
  string encoded_password;
  string *result;
  char *in_stack_ffffffffffffff28;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38);
  util::from_utf8(result,(string *)this,password._4_4_);
  if (*(int *)(in_RSI + 0x600) == 6) {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 != 0x2c) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unexpected password salt size");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)in_RDI);
    std::__cxx11::string::resize((ulong)in_RDI);
    ctx = (EVP_PKEY_CTX *)std::__cxx11::string::c_str();
    key = (uchar *)std::__cxx11::string::length();
    keylen = (size_t *)std::__cxx11::string::operator[](in_RSI + 0x608);
    std::__cxx11::string::operator[](in_RSI + 0x608);
    util::endianness<util::little_endian>::load<unsigned_int>(in_stack_ffffffffffffff28);
    std::__cxx11::string::operator[]((ulong)in_RDI);
    crypto::pbkdf2<crypto::iterated_hash<crypto::sha256_transform>_>::derive(ctx,key,keylen);
    puVar2 = (undefined8 *)std::__cxx11::string::operator[]((ulong)in_RDI);
    puVar3 = (undefined8 *)std::__cxx11::string::operator[](in_RSI + 0x608);
    *puVar2 = *puVar3;
    puVar2[1] = puVar3[1];
    puVar2[2] = puVar3[2];
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_38);
  }
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string info::get_key(const std::string & password) {
	
	std::string encoded_password;
	util::from_utf8(password, encoded_password, codepage);
	
	if(header.password.type == crypto::PBKDF2_SHA256_XChaCha20) {
		
		#if INNOEXTRACT_HAVE_DECRYPTION
		
		// 16 bytes PBKDF2 salt + 4 bytes PBKDF2 iterations + 24 bytes ChaCha20 base nonce
		if(header.password_salt.length() != 20 + crypto::xchacha20::nonce_size) {
			throw std::runtime_error("unexpected password salt size");
		}
		
		std::string result;
		result.resize(crypto::xchacha20::key_size + crypto::xchacha20::nonce_size);
		typedef crypto::pbkdf2<crypto::sha256> pbkdf2;
		pbkdf2::derive(encoded_password.c_str(), encoded_password.length(), &header.password_salt[0], 16,
		               util::little_endian::load<boost::uint32_t>(&header.password_salt[16]), &result[0],
		               crypto::xchacha20::key_size);
		
		std::memcpy(&result[crypto::xchacha20::key_size], &header.password_salt[20],
		            crypto::xchacha20::nonce_size);
		
		return result;
		
		#endif
		
	}
	
	return encoded_password;
}